

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O2

int CfdGetDescriptorRootData
              (void *handle,void *descriptor_handle,int *script_type,char **locking_script,
              char **address,int *hash_type,char **redeem_script,int *key_type,char **pubkey,
              char **ext_pubkey,char **ext_privkey,char **schnorr_pubkey,char **tree_string,
              bool *is_multisig,uint32_t *max_key_num,uint32_t *req_sig_num)

{
  AddressType AVar1;
  DescriptorKeyType DVar2;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *this;
  long lVar3;
  long lVar4;
  bool bVar5;
  reference pvVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  CfdException *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar11;
  char *local_258;
  char *local_250;
  char *local_240;
  char *local_238;
  char *work_tree_string;
  char *work_schnorr_pubkey;
  Pubkey pubkey_obj;
  ExtPrivkey local_208;
  char **local_190;
  char **local_188;
  char *work_ext_pubkey;
  char *work_pubkey;
  char *work_redeem_script;
  char *work_address;
  char *work_locking_script;
  void *local_158;
  SchnorrPubkey schnorr_pubkey_obj;
  ExtPrivkey ext_privkey_obj;
  SchnorrPubkey spk;
  ExtPubkey ext_pubkey_obj;
  
  work_locking_script = (char *)0x0;
  work_address = (char *)0x0;
  work_redeem_script = (char *)0x0;
  work_pubkey = (char *)0x0;
  work_ext_pubkey = (char *)0x0;
  local_190 = address;
  local_188 = locking_script;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&ext_privkey_obj,"Descriptor",(allocator *)&local_208);
  cfd::capi::CheckBuffer(descriptor_handle,(string *)&ext_privkey_obj);
  std::__cxx11::string::~string((string *)&ext_privkey_obj);
  this = *(vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> **)
          ((long)descriptor_handle + 0x10);
  if ((this == (vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *)0x0)
     || ((this->
         super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>).
         _M_impl.super__Vector_impl_data._M_start ==
         (this->
         super__Vector_base<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>).
         _M_impl.super__Vector_impl_data._M_finish)) {
    ext_privkey_obj.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_address.cpp";
    ext_privkey_obj.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x1fd;
    ext_privkey_obj.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdGetDescriptorRootData";
    cfd::core::logger::warn<>((CfdSourceLocation *)&ext_privkey_obj,"invalid script_root.");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&ext_privkey_obj,"Failed to parameter. invalid script_root.",
               (allocator *)&local_208);
    cfd::core::CfdException::CfdException(this_00,kCfdOutOfRangeError,(string *)&ext_privkey_obj);
    __cxa_throw(this_00,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_158 = descriptor_handle;
  pvVar6 = std::vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_>::at
                     (this,0);
  AVar1 = pvVar6->address_type;
  if (script_type != (int *)0x0) {
    *script_type = pvVar6->type;
  }
  if (local_188 == (char **)0x0) {
LAB_0035399c:
    local_238 = (char *)0x0;
  }
  else {
    bVar5 = cfd::core::Script::IsEmpty(&pvVar6->locking_script);
    if (bVar5) goto LAB_0035399c;
    cfd::core::Script::GetHex_abi_cxx11_((string *)&ext_privkey_obj,&pvVar6->locking_script);
    local_238 = cfd::capi::CreateString((string *)&ext_privkey_obj);
    work_locking_script = local_238;
    std::__cxx11::string::~string((string *)&ext_privkey_obj);
  }
  if (local_190 == (char **)0x0) {
LAB_00353a4a:
    local_250 = (char *)0x0;
  }
  else {
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&ext_privkey_obj,&pvVar6->address);
    lVar3 = CONCAT44(ext_privkey_obj.serialize_data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_4_,
                     ext_privkey_obj.serialize_data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish._0_4_);
    std::__cxx11::string::~string((string *)&ext_privkey_obj);
    if (lVar3 == 0) goto LAB_00353a4a;
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&ext_privkey_obj,&pvVar6->address);
    if (CONCAT44(ext_privkey_obj.serialize_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_,
                 ext_privkey_obj.serialize_data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish._0_4_) == 0) {
      local_250 = (char *)0x0;
    }
    else {
      local_250 = cfd::capi::CreateString((string *)&ext_privkey_obj);
      work_address = local_250;
    }
    std::__cxx11::string::~string((string *)&ext_privkey_obj);
  }
  if (hash_type != (int *)0x0) {
    *hash_type = pvVar6->address_type;
  }
  if (redeem_script == (char **)0x0) {
LAB_00353a98:
    local_240 = (char *)0x0;
  }
  else {
    bVar5 = cfd::core::Script::IsEmpty(&pvVar6->redeem_script);
    if (bVar5) goto LAB_00353a98;
    cfd::core::Script::GetHex_abi_cxx11_((string *)&ext_privkey_obj,&pvVar6->redeem_script);
    local_240 = cfd::capi::CreateString((string *)&ext_privkey_obj);
    work_redeem_script = local_240;
    std::__cxx11::string::~string((string *)&ext_privkey_obj);
  }
  if (key_type != (int *)0x0) {
    *key_type = pvVar6->key_type;
  }
  cfd::core::Pubkey::Pubkey(&pubkey_obj);
  cfd::core::ExtPubkey::ExtPubkey(&ext_pubkey_obj);
  cfd::core::ExtPrivkey::ExtPrivkey(&ext_privkey_obj);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&schnorr_pubkey_obj);
  DVar2 = pvVar6->key_type;
  if (DVar2 == kDescriptorKeyBip32) {
    cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)&local_208,&pvVar6->key);
    cfd::core::ExtPubkey::operator=(&ext_pubkey_obj,(ExtPubkey *)&local_208);
    cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&local_208);
    cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_208,&ext_pubkey_obj);
LAB_00353c33:
    pvVar11 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj;
LAB_00353c38:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(pvVar11,&local_208);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_208);
  }
  else {
    if (DVar2 == kDescriptorKeyBip32Priv) {
      cfd::core::ExtPrivkey::ExtPrivkey(&local_208,&pvVar6->key);
      cfd::core::ExtPrivkey::operator=(&ext_privkey_obj,&local_208);
      cfd::core::ExtPrivkey::~ExtPrivkey(&local_208);
      cfd::core::ExtPrivkey::GetExtPubkey((ExtPubkey *)&local_208,&ext_privkey_obj);
      cfd::core::ExtPubkey::operator=(&ext_pubkey_obj,(ExtPubkey *)&local_208);
      cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)&local_208);
      cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_208,&ext_pubkey_obj);
      goto LAB_00353c33;
    }
    if (DVar2 == kDescriptorKeySchnorr) {
      if ((pvVar6->key)._M_string_length == 0) goto LAB_00353c4d;
      cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_208,&pvVar6->key);
      pvVar11 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey_obj;
      goto LAB_00353c38;
    }
    if ((pvVar6->key)._M_string_length != 0) {
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_208,&pvVar6->key);
      goto LAB_00353c33;
    }
  }
LAB_00353c4d:
  if ((schnorr_pubkey == (char **)0x0) || (AVar1 != kTaprootAddress)) {
    local_258 = (char *)0x0;
    pcVar7 = (char *)0x0;
    if (AVar1 != kTaprootAddress) goto LAB_00353da3;
  }
  else {
    bVar5 = cfd::core::Pubkey::IsValid(&pubkey_obj);
    if (bVar5) {
      cfd::core::SchnorrPubkey::FromPubkey(&spk,&pubkey_obj,(bool *)0x0);
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&local_208,&spk);
      local_258 = cfd::capi::CreateString((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&spk);
    }
    else {
      bVar5 = cfd::core::SchnorrPubkey::IsValid(&schnorr_pubkey_obj);
      if (bVar5) {
        cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&local_208,&schnorr_pubkey_obj);
        local_258 = cfd::capi::CreateString((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_208);
      }
      else {
        local_258 = (char *)0x0;
      }
    }
  }
  bVar5 = cfd::core::TaprootScriptTree::IsValid(&pvVar6->tree);
  if (bVar5) {
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)&local_208,&(pvVar6->tree).super_TapBranch);
    pcVar7 = cfd::capi::CreateString((string *)&local_208);
  }
  else {
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)&local_208,&pvVar6->branch);
    std::__cxx11::string::~string((string *)&local_208);
    if (local_208.serialize_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = (char *)0x0;
      goto LAB_00353da3;
    }
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)&local_208,&pvVar6->branch);
    pcVar7 = cfd::capi::CreateString((string *)&local_208);
  }
  std::__cxx11::string::~string((string *)&local_208);
LAB_00353da3:
  if ((pubkey == (char **)0x0) || (bVar5 = cfd::core::Pubkey::IsValid(&pubkey_obj), !bVar5)) {
    pcVar8 = (char *)0x0;
  }
  else {
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)&local_208,&pubkey_obj);
    pcVar8 = cfd::capi::CreateString((string *)&local_208);
    work_pubkey = pcVar8;
    std::__cxx11::string::~string((string *)&local_208);
  }
  if ((ext_pubkey == (char **)0x0) ||
     (bVar5 = cfd::core::ExtPubkey::IsValid(&ext_pubkey_obj), !bVar5)) {
    pcVar9 = (char *)0x0;
  }
  else {
    cfd::core::ExtPubkey::ToString_abi_cxx11_((string *)&local_208,&ext_pubkey_obj);
    pcVar9 = cfd::capi::CreateString((string *)&local_208);
    work_ext_pubkey = pcVar9;
    std::__cxx11::string::~string((string *)&local_208);
  }
  if ((ext_privkey == (char **)0x0) ||
     (bVar5 = cfd::core::ExtPrivkey::IsValid(&ext_privkey_obj), !bVar5)) {
    pcVar10 = (char *)0x0;
  }
  else {
    cfd::core::ExtPrivkey::ToString_abi_cxx11_((string *)&local_208,&ext_privkey_obj);
    pcVar10 = cfd::capi::CreateString((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
  }
  if (is_multisig != (bool *)0x0) {
    lVar3 = **(long **)((long)local_158 + 0x20);
    lVar4 = (*(long **)((long)local_158 + 0x20))[1];
    *is_multisig = lVar3 != lVar4;
    if (lVar3 != lVar4) {
      *is_multisig = true;
      if (max_key_num != (uint32_t *)0x0) {
        *max_key_num = (uint32_t)((lVar4 - lVar3) / 0x28);
      }
      if (req_sig_num != (uint32_t *)0x0) {
        *req_sig_num = pvVar6->multisig_req_sig_num;
      }
    }
  }
  if (local_238 != (char *)0x0) {
    *local_188 = local_238;
  }
  if (local_250 != (char *)0x0) {
    *local_190 = local_250;
  }
  if (local_240 != (char *)0x0) {
    *redeem_script = local_240;
  }
  if (pcVar8 != (char *)0x0) {
    *pubkey = pcVar8;
  }
  if (pcVar9 != (char *)0x0) {
    *ext_pubkey = pcVar9;
  }
  if (pcVar10 != (char *)0x0) {
    *ext_privkey = pcVar10;
  }
  if (local_258 != (char *)0x0) {
    *schnorr_pubkey = local_258;
  }
  if (pcVar7 != (char *)0x0) {
    *tree_string = pcVar7;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey_obj);
  cfd::core::ExtPrivkey::~ExtPrivkey(&ext_privkey_obj);
  cfd::core::ExtPubkey::~ExtPubkey(&ext_pubkey_obj);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj);
  return 0;
}

Assistant:

int CfdGetDescriptorRootData(
    void* handle, void* descriptor_handle, int* script_type,
    char** locking_script, char** address, int* hash_type,
    char** redeem_script, int* key_type, char** pubkey, char** ext_pubkey,
    char** ext_privkey, char** schnorr_pubkey, char** tree_string,
    bool* is_multisig, uint32_t* max_key_num, uint32_t* req_sig_num) {
  int ret = CfdErrorCode::kCfdUnknownError;
  char* work_locking_script = nullptr;
  char* work_address = nullptr;
  char* work_redeem_script = nullptr;
  char* work_pubkey = nullptr;
  char* work_ext_pubkey = nullptr;
  char* work_ext_privkey = nullptr;
  char* work_schnorr_pubkey = nullptr;
  char* work_tree_string = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(descriptor_handle, kPrefixOutputDescriptor);

    CfdCapiOutputDescriptor* buffer =
        static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
    if ((buffer->script_root == nullptr) || buffer->script_root->empty()) {
      warn(CFD_LOG_SOURCE, "invalid script_root.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. invalid script_root.");
    }

    const DescriptorScriptData& desc_data = buffer->script_root->at(0);
    bool is_taproot = (desc_data.address_type == AddressType::kTaprootAddress);
    if (script_type != nullptr) *script_type = desc_data.type;
    if ((locking_script != nullptr) && (!desc_data.locking_script.IsEmpty())) {
      work_locking_script = CreateString(desc_data.locking_script.GetHex());
    }
    if ((address != nullptr) && (!desc_data.address.GetAddress().empty())) {
      std::string addr = desc_data.address.GetAddress();
      if (!addr.empty()) work_address = CreateString(addr);
    }
    if (hash_type != nullptr) {
      *hash_type = desc_data.address_type;
    }
    if ((redeem_script != nullptr) && (!desc_data.redeem_script.IsEmpty())) {
      work_redeem_script = CreateString(desc_data.redeem_script.GetHex());
    }
    if (key_type != nullptr) {
      *key_type = desc_data.key_type;
    }

    Pubkey pubkey_obj;
    ExtPubkey ext_pubkey_obj;
    ExtPrivkey ext_privkey_obj;
    SchnorrPubkey schnorr_pubkey_obj;
    switch (desc_data.key_type) {
      case DescriptorKeyType::kDescriptorKeyBip32Priv:
        ext_privkey_obj = ExtPrivkey(desc_data.key);
        ext_pubkey_obj = ext_privkey_obj.GetExtPubkey();
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyBip32:
        ext_pubkey_obj = ExtPubkey(desc_data.key);
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeySchnorr:
        if (!desc_data.key.empty()) {
          schnorr_pubkey_obj = SchnorrPubkey(desc_data.key);
        }
        break;
      case DescriptorKeyType::kDescriptorKeyPublic:
      default:
        if (!desc_data.key.empty()) pubkey_obj = Pubkey(desc_data.key);
        break;
    }
    if (is_taproot && (schnorr_pubkey != nullptr)) {
      if (pubkey_obj.IsValid()) {
        auto spk = SchnorrPubkey::FromPubkey(pubkey_obj);
        work_schnorr_pubkey = CreateString(spk.GetHex());
      } else if (schnorr_pubkey_obj.IsValid()) {
        work_schnorr_pubkey = CreateString(schnorr_pubkey_obj.GetHex());
      }
    }
    if (is_taproot && desc_data.tree.IsValid()) {
      work_tree_string = CreateString(desc_data.tree.ToString());
    } else if (is_taproot && !desc_data.branch.ToString().empty()) {
      work_tree_string = CreateString(desc_data.branch.ToString());
    }
    if ((pubkey != nullptr) && (pubkey_obj.IsValid())) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    }
    if ((ext_pubkey != nullptr) && (ext_pubkey_obj.IsValid())) {
      work_ext_pubkey = CreateString(ext_pubkey_obj.ToString());
    }
    if ((ext_privkey != nullptr) && (ext_privkey_obj.IsValid())) {
      work_ext_privkey = CreateString(ext_privkey_obj.ToString());
    }
    if (is_multisig != nullptr) {
      *is_multisig = !buffer->multisig_key_list->empty();
      if (!buffer->multisig_key_list->empty()) {
        *is_multisig = true;
        if (max_key_num != nullptr) {
          *max_key_num =
              static_cast<uint32_t>(buffer->multisig_key_list->size());
        }
        if (req_sig_num != nullptr) {
          *req_sig_num = static_cast<uint32_t>(desc_data.multisig_req_sig_num);
        }
      }
    }

    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_address != nullptr) *address = work_address;
    if (work_redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    if (work_ext_pubkey != nullptr) *ext_pubkey = work_ext_pubkey;
    if (work_ext_privkey != nullptr) *ext_privkey = work_ext_privkey;
    if (work_schnorr_pubkey != nullptr) *schnorr_pubkey = work_schnorr_pubkey;
    if (work_tree_string != nullptr) *tree_string = work_tree_string;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    ret = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(
      &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
      &work_ext_pubkey, &work_ext_privkey);
  FreeBufferOnError(&work_schnorr_pubkey, &work_tree_string);
  return ret;
}